

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O2

int resrob(sunrealtype tres,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  pdVar2 = (double *)N_VGetArrayPointer(yp);
  pdVar3 = (double *)N_VGetArrayPointer(rr);
  dVar4 = *pdVar1 * -0.04 + pdVar1[1] * 10000.0 * pdVar1[2];
  *pdVar3 = dVar4;
  pdVar3[1] = (pdVar1[1] * -30000000.0 * pdVar1[1] - dVar4) - pdVar2[1];
  *pdVar3 = dVar4 - *pdVar2;
  pdVar3[2] = *pdVar1 + pdVar1[1] + pdVar1[2] + -1.0;
  return 0;
}

Assistant:

int resrob(sunrealtype tres, N_Vector yy, N_Vector yp, N_Vector rr,
           void* user_data)
{
  sunrealtype *yval, *ypval, *rval;

  yval  = N_VGetArrayPointer(yy);
  ypval = N_VGetArrayPointer(yp);
  rval  = N_VGetArrayPointer(rr);

  rval[0] = SUN_RCONST(-0.04) * yval[0] + SUN_RCONST(1.0e4) * yval[1] * yval[2];
  rval[1] = -rval[0] - SUN_RCONST(3.0e7) * yval[1] * yval[1] - ypval[1];
  rval[0] -= ypval[0];
  rval[2] = yval[0] + yval[1] + yval[2] - ONE;

  return (0);
}